

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borromean_impl.h
# Opt level: O0

int secp256k1_borromean_verify
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_scalar *evalues,uchar *e0,
              secp256k1_scalar *s,secp256k1_gej *pubs,size_t *rsizes,size_t nrings,uchar *m,
              size_t mlen)

{
  int iVar1;
  uint64_t *puVar2;
  long in_RCX;
  void *in_RDX;
  long in_RSI;
  long in_R8;
  long in_R9;
  ulong in_stack_00000008;
  int overflow;
  size_t size;
  size_t count;
  size_t j;
  size_t i;
  uchar tmp [33];
  secp256k1_sha256 sha256_e0;
  secp256k1_scalar ens;
  secp256k1_ge rge;
  secp256k1_gej rgej;
  secp256k1_scalar *in_stack_00000a40;
  secp256k1_scalar *in_stack_00000a48;
  secp256k1_gej *in_stack_00000a50;
  secp256k1_gej *in_stack_00000a58;
  secp256k1_ecmult_context *in_stack_00000a60;
  size_t *size_00;
  undefined4 in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe14;
  secp256k1_ge *in_stack_fffffffffffffe18;
  secp256k1_sha256 *hash;
  ulong local_1d8;
  ulong local_1d0;
  uchar *in_stack_fffffffffffffe38;
  secp256k1_sha256 *in_stack_fffffffffffffe40;
  secp256k1_gej *in_stack_fffffffffffffe58;
  secp256k1_ge *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe78;
  size_t in_stack_fffffffffffffe80;
  uchar *in_stack_fffffffffffffe88;
  size_t in_stack_fffffffffffffe90;
  uchar *in_stack_fffffffffffffe98;
  uchar *in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffeb0;
  secp256k1_scalar local_130 [3];
  secp256k1_gej local_b8;
  long local_38;
  long local_30;
  long local_28;
  void *local_20;
  long local_18;
  
  hash = (secp256k1_sha256 *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  secp256k1_sha256_initialize((secp256k1_sha256 *)&stack0xfffffffffffffe68);
  local_1d0 = 0;
  do {
    if (in_stack_00000008 <= local_1d0) {
      secp256k1_sha256_write
                (hash,(uchar *)in_stack_fffffffffffffe18,
                 CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      secp256k1_sha256_finalize(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      iVar1 = memcmp(local_20,&stack0xfffffffffffffe38,0x20);
      return (uint)(iVar1 == 0);
    }
    size_00 = (size_t *)0x0;
    secp256k1_borromean_hash
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
               in_stack_fffffffffffffeb0);
    secp256k1_scalar_set_b32
              ((secp256k1_scalar *)hash,(uchar *)in_stack_fffffffffffffe18,
               (int *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    for (local_1d8 = 0; local_1d8 < *(ulong *)(local_38 + local_1d0 * 8); local_1d8 = local_1d8 + 1)
    {
      if ((((in_stack_fffffffffffffe14 != 0) ||
           (iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)(local_28 + (long)hash * 0x20)),
           iVar1 != 0)) || (iVar1 = secp256k1_scalar_is_zero(local_130), iVar1 != 0)) ||
         (iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)(local_30 + (long)hash * 0x80)),
         iVar1 != 0)) {
        return 0;
      }
      if (local_18 != 0) {
        puVar2 = (uint64_t *)(local_18 + (long)hash * 0x20);
        *puVar2 = local_130[0].d[0];
        puVar2[1] = local_130[0].d[1];
        puVar2[2] = local_130[0].d[2];
        puVar2[3] = local_130[0].d[3];
      }
      secp256k1_ecmult(in_stack_00000a60,in_stack_00000a58,in_stack_00000a50,in_stack_00000a48,
                       in_stack_00000a40);
      iVar1 = secp256k1_gej_is_infinity(&local_b8);
      if (iVar1 != 0) {
        return 0;
      }
      secp256k1_ge_set_gej_var(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      secp256k1_eckey_pubkey_serialize
                (in_stack_fffffffffffffe18,
                 (uchar *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),size_00,0);
      if (local_1d8 == *(long *)(local_38 + local_1d0 * 8) - 1U) {
        secp256k1_sha256_write
                  (hash,(uchar *)in_stack_fffffffffffffe18,
                   CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      }
      else {
        size_00 = (size_t *)(local_1d8 + 1);
        secp256k1_borromean_hash
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                   in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                   in_stack_fffffffffffffeb0);
        secp256k1_scalar_set_b32
                  ((secp256k1_scalar *)hash,(uchar *)in_stack_fffffffffffffe18,
                   (int *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      }
      hash = (secp256k1_sha256 *)((long)hash->s + 1);
    }
    local_1d0 = local_1d0 + 1;
  } while( true );
}

Assistant:

int secp256k1_borromean_verify(const secp256k1_ecmult_context* ecmult_ctx, secp256k1_scalar *evalues, const unsigned char *e0,
 const secp256k1_scalar *s, const secp256k1_gej *pubs, const size_t *rsizes, size_t nrings, const unsigned char *m, size_t mlen) {
    secp256k1_gej rgej;
    secp256k1_ge rge;
    secp256k1_scalar ens;
    secp256k1_sha256 sha256_e0;
    unsigned char tmp[33];
    size_t i;
    size_t j;
    size_t count;
    size_t size;
    int overflow;
    VERIFY_CHECK(ecmult_ctx != NULL);
    VERIFY_CHECK(e0 != NULL);
    VERIFY_CHECK(s != NULL);
    VERIFY_CHECK(pubs != NULL);
    VERIFY_CHECK(rsizes != NULL);
    VERIFY_CHECK(nrings > 0);
    VERIFY_CHECK(m != NULL);
    count = 0;
    secp256k1_sha256_initialize(&sha256_e0);
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_borromean_hash(tmp, m, mlen, e0, 32, i, 0);
        secp256k1_scalar_set_b32(&ens, tmp, &overflow);
        for (j = 0; j < rsizes[i]; j++) {
            if (overflow || secp256k1_scalar_is_zero(&s[count]) || secp256k1_scalar_is_zero(&ens) || secp256k1_gej_is_infinity(&pubs[count])) {
                return 0;
            }
            if (evalues) {
                /*If requested, save the challenges for proof rewind.*/
                evalues[count] = ens;
            }
            secp256k1_ecmult(ecmult_ctx, &rgej, &pubs[count], &ens, &s[count]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            /* OPT: loop can be hoisted and split to use batch inversion across all the rings; this would make it much faster. */
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
            if (j != rsizes[i] - 1) {
                secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j + 1);
                secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            } else {
                secp256k1_sha256_write(&sha256_e0, tmp, size);
            }
            count++;
        }
    }
    secp256k1_sha256_write(&sha256_e0, m, mlen);
    secp256k1_sha256_finalize(&sha256_e0, tmp);
    return memcmp(e0, tmp, 32) == 0;
}